

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_type.cpp
# Opt level: O0

content_type * __thiscall
cppcms::http::content_type::operator=(content_type *this,content_type *other)

{
  shared_ptr<cppcms::http::content_type::data> *in_RSI;
  content_type *in_RDI;
  
  std::shared_ptr<cppcms::http::content_type::data>::operator=(in_RSI,&in_RDI->d);
  return in_RDI;
}

Assistant:

content_type &content_type::operator=(content_type &&other)
	{
		d=std::move(other.d);
		return *this;
	}